

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh,int64_t *index)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018aeae0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018ae738,matind,mesh,index);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018ae438;
  pzgeom::TPZNodeRep<4,_pztopology::TPZTetrahedron>::TPZNodeRep
            (&(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>,&PTR_PTR_018b5568,
             nodeindices);
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.super_TPZTetrahedron.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoTetrahedra_018b5510;
  lVar1 = 0x78;
  do {
    *(undefined ***)((long)(&this->fGeo + -2) + lVar1) = &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x50) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1e0);
  lVar1 = 0x78;
  do {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x50) = 0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1e0);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) 
: TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh,index) , fGeo(nodeindices) 
{
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}